

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::LoadStoreMachine::GenLoadShader<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,LoadStoreMachine *this,int stage,GLenum internalformat,
          Vector<float,_4> *expected_value)

{
  ostream *poVar1;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream os;
  Vector<float,_4> *expected_value_local;
  GLenum internalformat_local;
  int stage_local;
  LoadStoreMachine *this_local;
  
  os._368_8_ = expected_value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"\n#define KSIZE 100");
  if (stage == 4) {
    std::operator<<((ostream *)local_1a0,"\nlayout(local_size_x = KSIZE) in;");
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1d0,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,", binding = 3) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_1f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_210,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,", binding = 2) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_230,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_250,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,", binding = 1) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_270,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_290,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,", binding = 0) readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_2b0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  std::operator<<(poVar1,
                  "image2DArray g_image_2darray;\nlayout(std430) buffer out_data {\n  ivec4 o_color[KSIZE];\n};\nvoid main() {"
                 );
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (stage == 0) {
    poVar1 = std::operator<<((ostream *)local_1a0,"\n  ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_2d0,(ShaderImageLoadStoreBase *)this);
    poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
    poVar1 = std::operator<<(poVar1,"vec4 g_value = ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_2f0,(ShaderImageLoadStoreBase *)this);
    poVar1 = std::operator<<(poVar1,(string *)&local_2f0);
    poVar1 = std::operator<<(poVar1,"vec4(o_color[gl_VertexID]) + ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_310,(ShaderImageLoadStoreBase *)this);
    poVar1 = std::operator<<(poVar1,(string *)&local_310);
    poVar1 = std::operator<<(poVar1,"vec4");
    poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
    std::operator<<(poVar1,";");
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  else if (stage == 4) {
    poVar1 = std::operator<<((ostream *)local_1a0,"\n  ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_330,(ShaderImageLoadStoreBase *)this);
    poVar1 = std::operator<<(poVar1,(string *)&local_330);
    poVar1 = std::operator<<(poVar1,"vec4 g_value = ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_350,(ShaderImageLoadStoreBase *)this);
    poVar1 = std::operator<<(poVar1,(string *)&local_350);
    poVar1 = std::operator<<(poVar1,"vec4(o_color[gl_GlobalInvocationID.x]) + ");
    ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_370,(ShaderImageLoadStoreBase *)this);
    poVar1 = std::operator<<(poVar1,(string *)&local_370);
    poVar1 = std::operator<<(poVar1,"vec4");
    poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
    std::operator<<(poVar1,";");
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_330);
  }
  std::operator<<((ostream *)local_1a0,
                  "\n  int g_index[6] = int[](o_color[0].x, o_color[0].y, o_color[0].z, o_color[0].w, o_color[1].r, o_color[1].g);"
                 );
  if (stage == 0) {
    std::operator<<((ostream *)local_1a0,"\n  ivec2 coord = ivec2(gl_VertexID, g_index[0]);");
  }
  else if (stage == 4) {
    std::operator<<((ostream *)local_1a0,
                    "\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);");
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"\n  vec4 r = vec4(0.0, 1.0, 0.0, 1.0);\n  ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_390,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_390);
  std::operator<<(poVar1,
                  "vec4 v;\n  v = imageLoad(g_image_2d, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 2.0);\n  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 3.0);\n  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 6.0);\n  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 23.0);\n  o_color[coord.x] = ivec4(r);\n}"
                 );
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenLoadShader(int stage, GLenum internalformat, const T& expected_value)
	{
		std::ostringstream os;
		os << NL "#define KSIZE 100";
		if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = KSIZE) in;";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 3) readonly uniform "
		   << TypePrefix<T>() << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ", binding = 2) readonly uniform " << TypePrefix<T>() << "image3D g_image_3d;" NL "layout("
		   << FormatEnumToString(internalformat) << ", binding = 1) readonly uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat)
		   << ", binding = 0) readonly uniform " << TypePrefix<T>()
		   << "image2DArray g_image_2darray;" NL "layout(std430) buffer out_data {" NL "  ivec4 o_color[KSIZE];" NL
			  "};" NL "void main() {";

		if (stage == 0)
		{ // VS
			os << NL "  " << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>() << "vec4(o_color[gl_VertexID]) + "
			   << TypePrefix<T>() << "vec4" << expected_value << ";";
		}
		else if (stage == 4)
		{ // CS
			os << NL "  " << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>()
			   << "vec4(o_color[gl_GlobalInvocationID.x]) + " << TypePrefix<T>() << "vec4" << expected_value << ";";
		}

		os << NL "  int g_index[6] = int[](o_color[0].x, o_color[0].y, o_color[0].z, o_color[0].w, o_color[1].r, "
				 "o_color[1].g);";
		if (stage == 0)
		{ // VS
			os << NL "  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
		}
		os << NL "  vec4 r = vec4(0.0, 1.0, 0.0, 1.0);" NL "  " << TypePrefix<T>()
		   << "vec4 v;" NL "  v = imageLoad(g_image_2d, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 2.0);" NL
			  "  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 3.0);" NL
			  "  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 6.0);" NL
			  "  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 23.0);" NL "  o_color[coord.x] = ivec4(r);" NL
			  "}";
		return os.str();
	}